

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockStrictOrderTest_orderUsingNCalls_TestShell::createTest
          (TEST_MockStrictOrderTest_orderUsingNCalls_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockStrictOrderTest.cpp"
                                  ,0xb5);
  TEST_MockStrictOrderTest_orderUsingNCalls_Test::TEST_MockStrictOrderTest_orderUsingNCalls_Test
            ((TEST_MockStrictOrderTest_orderUsingNCalls_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockStrictOrderTest, orderUsingNCalls)
{
    mock().strictOrder();

    mock().expectOneCall("foo1");
    mock().expectNCalls(2, "foo2");
    mock().expectOneCall("foo1");
    mock().expectNCalls(3, "foo2");

    mock().actualCall("foo1");
    mock().actualCall("foo2");
    mock().actualCall("foo2");
    mock().actualCall("foo1");
    mock().actualCall("foo2");
    mock().actualCall("foo2");
    mock().actualCall("foo2");

    mock().checkExpectations();
}